

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  size_type *psVar1;
  char *__s;
  char *pcVar2;
  long *local_68 [2];
  long local_58 [2];
  undefined1 local_48 [8];
  string dir;
  
  __s = (this->pathname_)._M_dataplus._M_p;
  pcVar2 = strrchr(__s,0x2f);
  psVar1 = &dir._M_string_length;
  dir._M_dataplus._M_p = (pointer)0x0;
  dir._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])psVar1;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)local_48,0,(char *)0x0,0x13c419);
  }
  else {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,__s,pcVar2 + 1);
    std::__cxx11::string::operator=((string *)local_48,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  FilePath(__return_storage_ptr__,(string *)local_48);
  if (local_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_48,
                    CONCAT71(dir._M_string_length._1_7_,(undefined1)dir._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}